

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::WasmByteCodeWriter::AsmBr(WasmByteCodeWriter *this,ByteCodeLabel labelID,OpCodeAsmJs op)

{
  ByteCodeWriter *this_00;
  undefined1 local_34 [8];
  OpLayoutAsmBr data;
  
  this_00 = &this->super_ByteCodeWriter;
  ByteCodeWriter::CheckOpen(this_00);
  ByteCodeWriter::CheckLabel(this_00,labelID);
  ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)0>
            (&(this->super_ByteCodeWriter).m_byteCodeData,op,local_34,4,this_00,false);
  AddJumpOffset(this,EndOfBlock,labelID,4);
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmBr(ByteCodeLabel labelID, OpCodeAsmJs op)
    {
        CheckOpen();
        CheckLabel(labelID);

        size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutAsmBr) - offsetof(OpLayoutAsmBr, RelativeJumpOffset);
        OpLayoutAsmBr data;
        data.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
        AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
    }